

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O3

cio_error cio_uart_get_baud_rate(cio_uart *port,cio_uart_baud_rate *baud_rate)

{
  cio_error cVar1;
  speed_t sVar2;
  cio_uart_baud_rate cVar3;
  termios tty;
  
  if (port != (cio_uart *)0x0) {
    cVar1 = get_current_settings(port,&tty);
    if (cVar1 == CIO_SUCCESS) {
      sVar2 = cfgetispeed((termios *)&tty);
      switch(sVar2) {
      case 1:
        cVar3 = CIO_UART_BAUD_RATE_50;
        break;
      case 2:
        cVar3 = CIO_UART_BAUD_RATE_75;
        break;
      case 3:
        cVar3 = CIO_UART_BAUD_RATE_110;
        break;
      case 4:
        cVar3 = CIO_UART_BAUD_RATE_134;
        break;
      case 5:
        cVar3 = CIO_UART_BAUD_RATE_150;
        break;
      case 6:
        cVar3 = CIO_UART_BAUD_RATE_200;
        break;
      case 7:
        cVar3 = CIO_UART_BAUD_RATE_300;
        break;
      case 8:
        cVar3 = CIO_UART_BAUD_RATE_600;
        break;
      case 9:
        cVar3 = CIO_UART_BAUD_RATE_1200;
        break;
      case 10:
        cVar3 = CIO_UART_BAUD_RATE_1800;
        break;
      case 0xb:
        cVar3 = CIO_UART_BAUD_RATE_2400;
        break;
      case 0xc:
        cVar3 = CIO_UART_BAUD_RATE_4800;
        break;
      case 0xd:
        cVar3 = CIO_UART_BAUD_RATE_9600;
        break;
      case 0xe:
        cVar3 = CIO_UART_BAUD_RATE_19200;
        break;
      case 0xf:
        cVar3 = CIO_UART_BAUD_RATE_38400;
        break;
      default:
        switch(sVar2) {
        case 0x1001:
          cVar3 = CIO_UART_BAUD_RATE_57600;
          break;
        case 0x1002:
          cVar3 = CIO_UART_BAUD_RATE_115200;
          break;
        case 0x1003:
          cVar3 = CIO_UART_BAUD_RATE_230400;
          break;
        case 0x1004:
          cVar3 = CIO_UART_BAUD_RATE_460800;
          break;
        case 0x1005:
          cVar3 = CIO_UART_BAUD_RATE_500000;
          break;
        case 0x1006:
          cVar3 = CIO_UART_BAUD_RATE_576000;
          break;
        case 0x1007:
          cVar3 = CIO_UART_BAUD_RATE_921600;
          break;
        case 0x1008:
          cVar3 = CIO_UART_BAUD_RATE_1000000;
          break;
        case 0x1009:
          cVar3 = CIO_UART_BAUD_RATE_1152000;
          break;
        case 0x100a:
          cVar3 = CIO_UART_BAUD_RATE_1500000;
          break;
        case 0x100b:
          cVar3 = CIO_UART_BAUD_RATE_2000000;
          break;
        case 0x100c:
          cVar3 = CIO_UART_BAUD_RATE_2500000;
          break;
        case 0x100d:
          cVar3 = CIO_UART_BAUD_RATE_3000000;
          break;
        case 0x100e:
          cVar3 = CIO_UART_BAUD_RATE_3500000;
          break;
        case 0x100f:
          cVar3 = CIO_UART_BAUD_RATE_4000000;
          break;
        default:
          return CIO_PROTOCOL_NOT_SUPPORTED;
        }
      }
      *baud_rate = cVar3;
      cVar1 = CIO_SUCCESS;
    }
    return cVar1;
  }
  return CIO_INVALID_ARGUMENT;
}

Assistant:

enum cio_error cio_uart_get_baud_rate(const struct cio_uart *port, enum cio_uart_baud_rate *baud_rate)
{
	if (cio_unlikely(port == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	struct termios tty;

	enum cio_error err = get_current_settings(port, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	speed_t speed = cfgetispeed(&tty);
	switch (speed) {
	case B50:
		*baud_rate = CIO_UART_BAUD_RATE_50;
		break;
	case B75:
		*baud_rate = CIO_UART_BAUD_RATE_75;
		break;
	case B110:
		*baud_rate = CIO_UART_BAUD_RATE_110;
		break;
	case B134:
		*baud_rate = CIO_UART_BAUD_RATE_134;
		break;
	case B150:
		*baud_rate = CIO_UART_BAUD_RATE_150;
		break;
	case B200:
		*baud_rate = CIO_UART_BAUD_RATE_200;
		break;
	case B300:
		*baud_rate = CIO_UART_BAUD_RATE_300;
		break;
	case B600:
		*baud_rate = CIO_UART_BAUD_RATE_600;
		break;
	case B1200:
		*baud_rate = CIO_UART_BAUD_RATE_1200;
		break;
	case B1800:
		*baud_rate = CIO_UART_BAUD_RATE_1800;
		break;
	case B2400:
		*baud_rate = CIO_UART_BAUD_RATE_2400;
		break;
	case B4800:
		*baud_rate = CIO_UART_BAUD_RATE_4800;
		break;
	case B9600:
		*baud_rate = CIO_UART_BAUD_RATE_9600;
		break;
	case B19200:
		*baud_rate = CIO_UART_BAUD_RATE_19200;
		break;
	case B38400:
		*baud_rate = CIO_UART_BAUD_RATE_38400;
		break;
	case B57600:
		*baud_rate = CIO_UART_BAUD_RATE_57600;
		break;
	case B115200:
		*baud_rate = CIO_UART_BAUD_RATE_115200;
		break;
	case B230400:
		*baud_rate = CIO_UART_BAUD_RATE_230400;
		break;
	case B460800:
		*baud_rate = CIO_UART_BAUD_RATE_460800;
		break;
	case B500000:
		*baud_rate = CIO_UART_BAUD_RATE_500000;
		break;
	case B576000:
		*baud_rate = CIO_UART_BAUD_RATE_576000;
		break;
	case B921600:
		*baud_rate = CIO_UART_BAUD_RATE_921600;
		break;
	case B1000000:
		*baud_rate = CIO_UART_BAUD_RATE_1000000;
		break;
	case B1152000:
		*baud_rate = CIO_UART_BAUD_RATE_1152000;
		break;
	case B1500000:
		*baud_rate = CIO_UART_BAUD_RATE_1500000;
		break;
	case B2000000:
		*baud_rate = CIO_UART_BAUD_RATE_2000000;
		break;
	case B2500000:
		*baud_rate = CIO_UART_BAUD_RATE_2500000;
		break;
	case B3000000:
		*baud_rate = CIO_UART_BAUD_RATE_3000000;
		break;
	case B3500000:
		*baud_rate = CIO_UART_BAUD_RATE_3500000;
		break;
	case B4000000:
		*baud_rate = CIO_UART_BAUD_RATE_4000000;
		break;
	default:
		return CIO_PROTOCOL_NOT_SUPPORTED;
	}

	return CIO_SUCCESS;
}